

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

void fmt::v5::anon_unknown_1::format_error_code(buffer *out,int error_code,string_view message)

{
  locale_ref loc;
  back_insert_range<fmt::v5::internal::basic_buffer<char>_> out_00;
  type_conflict4 tVar1;
  int value;
  type tVar2;
  basic_string_view<char> *this;
  void *in_RCX;
  basic_string_view<char> *__n;
  int in_EDX;
  void *__buf;
  uint32_t in_ESI;
  writer w;
  main_type abs_value;
  size_t error_code_size;
  char *in_stack_ffffffffffffff58;
  basic_buffer<char> *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff74;
  undefined4 uVar3;
  int local_88;
  void *local_80;
  int local_78;
  void *local_70;
  locale_ref local_50 [2];
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> local_40;
  uint32_t local_2c;
  long local_28;
  uint32_t local_1c;
  basic_string_view<char> local_10;
  
  local_1c = in_ESI;
  local_10.size_ = (size_t)in_RCX;
  local_10.data_._0_4_ = in_EDX;
  internal::basic_buffer<char>::resize(in_stack_ffffffffffffff60,(size_t)in_stack_ffffffffffffff58);
  local_28 = 8;
  local_2c = local_1c;
  tVar1 = internal::is_negative<int>(local_1c);
  uVar3 = CONCAT13(tVar1,(int3)in_stack_ffffffffffffff74);
  if (tVar1) {
    local_2c = -local_2c;
    local_28 = local_28 + 1;
  }
  value = internal::count_digits(local_2c);
  tVar2 = internal::to_unsigned<int>(value);
  local_28 = local_28 + (ulong)tVar2;
  back_insert_range<fmt::v5::internal::basic_buffer<char>_>::back_insert_range
            ((back_insert_range<fmt::v5::internal::basic_buffer<char>_> *)CONCAT44(uVar3,value),
             (basic_buffer<char> *)CONCAT44(tVar2,in_stack_ffffffffffffff68));
  internal::locale_ref::locale_ref(local_50);
  out_00.super_output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_void>
  .it_.container._4_4_ = uVar3;
  out_00.super_output_range<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_void>
  .it_.container._0_4_ = value;
  loc.locale_._4_4_ = tVar2;
  loc.locale_._0_4_ = in_stack_ffffffffffffff68;
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::basic_writer
            ((basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_> *)
             in_stack_ffffffffffffff60,out_00,loc);
  this = (basic_string_view<char> *)basic_string_view<char>::size(&local_10);
  __n = (basic_string_view<char> *)(500 - local_28);
  if (this <= __n) {
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (&local_40,(int)local_10.data_,(void *)local_10.size_,(size_t)__n);
    basic_string_view<char>::basic_string_view(this,in_stack_ffffffffffffff58);
    basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
              (&local_40,local_78,local_70,(size_t)__n);
  }
  basic_string_view<char>::basic_string_view(this,in_stack_ffffffffffffff58);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&local_40,local_88,local_80,(size_t)__n);
  basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>::write
            (&local_40,local_1c,__buf,(size_t)__n);
  return;
}

Assistant:

void format_error_code(internal::buffer &out, int error_code,
                       string_view message) FMT_NOEXCEPT {
  // Report error code making sure that the output fits into
  // inline_buffer_size to avoid dynamic memory allocation and potential
  // bad_alloc.
  out.resize(0);
  static const char SEP[] = ": ";
  static const char ERROR_STR[] = "error ";
  // Subtract 2 to account for terminating null characters in SEP and ERROR_STR.
  std::size_t error_code_size = sizeof(SEP) + sizeof(ERROR_STR) - 2;
  typedef internal::int_traits<int>::main_type main_type;
  main_type abs_value = static_cast<main_type>(error_code);
  if (internal::is_negative(error_code)) {
    abs_value = 0 - abs_value;
    ++error_code_size;
  }
  error_code_size += internal::to_unsigned(internal::count_digits(abs_value));
  writer w(out);
  if (message.size() <= inline_buffer_size - error_code_size) {
    w.write(message);
    w.write(SEP);
  }
  w.write(ERROR_STR);
  w.write(error_code);
  assert(out.size() <= inline_buffer_size);
}